

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bridge.cpp
# Opt level: O2

POMCPPrior * __thiscall despot::Bridge::CreatePOMCPPrior(Bridge *this,string *name)

{
  bool bVar1;
  UniformPOMCPPrior *this_00;
  ostream *poVar2;
  
  bVar1 = std::operator==(name,"UNIFORM");
  if (bVar1) {
    this_00 = (UniformPOMCPPrior *)operator_new(0x78);
    despot::UniformPOMCPPrior::UniformPOMCPPrior(this_00,(DSPOMDP *)this);
  }
  else {
    bVar1 = std::operator==(name,"DEFAULT");
    if (!bVar1) {
      bVar1 = std::operator==(name,"HELP");
      if (!bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Unsupported POMCP prior: ");
        poVar2 = std::operator<<(poVar2,(string *)name);
        std::endl<char,std::char_traits<char>>(poVar2);
        exit(1);
      }
    }
    this_00 = (UniformPOMCPPrior *)operator_new(0x78);
    BridgePOMCPPrior::BridgePOMCPPrior((BridgePOMCPPrior *)this_00,(DSPOMDP *)this);
  }
  return (POMCPPrior *)this_00;
}

Assistant:

POMCPPrior* Bridge::CreatePOMCPPrior(string name) const {
	if (name == "UNIFORM") {
		return new UniformPOMCPPrior(this);
	} else if (name == "DEFAULT" || name == "HELP") {
		return new BridgePOMCPPrior(this);
	} else {
		cerr << "Unsupported POMCP prior: " << name << endl;
		exit(1);
		return NULL;
	}
}